

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_diag_avx2_256_32.c
# Opt level: O3

parasail_result_t *
parasail_nw_table_diag_avx2_256_32
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix)

{
  ulong uVar1;
  int32_t iVar2;
  undefined4 uVar3;
  int *piVar4;
  int *piVar5;
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  int iVar14;
  int iVar15;
  int iVar16;
  uint uVar17;
  uint uVar18;
  parasail_result_t *ppVar19;
  undefined1 (*ptr) [16];
  int32_t *ptr_00;
  int32_t *ptr_01;
  int32_t *ptr_02;
  long lVar20;
  ulong uVar21;
  int iVar22;
  uint uVar23;
  ulong uVar24;
  int iVar25;
  ulong uVar26;
  uint uVar27;
  ulong uVar28;
  int iVar29;
  uint uVar30;
  ulong uVar31;
  uint uVar32;
  uint uVar33;
  uint uVar34;
  uint uVar35;
  int iVar36;
  ulong uVar37;
  undefined1 auVar38 [16];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  uint uVar42;
  undefined1 auVar43 [16];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 in_ZMM1 [64];
  undefined1 auVar46 [64];
  undefined1 auVar47 [16];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [16];
  undefined1 in_ZMM7 [64];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  long local_228;
  long local_220;
  long local_218;
  long local_210;
  long local_208;
  long local_200;
  long local_1f8;
  long local_1f0;
  undefined1 local_178 [32];
  undefined8 local_138;
  undefined1 auVar39 [32];
  undefined1 auVar48 [32];
  
  if (_s2 == (char *)0x0) {
    parasail_nw_table_diag_avx2_256_32_cold_7();
  }
  else if (s2Len < 1) {
    parasail_nw_table_diag_avx2_256_32_cold_6();
  }
  else if (open < 0) {
    parasail_nw_table_diag_avx2_256_32_cold_5();
  }
  else if (gap < 0) {
    parasail_nw_table_diag_avx2_256_32_cold_4();
  }
  else if (matrix == (parasail_matrix_t *)0x0) {
    parasail_nw_table_diag_avx2_256_32_cold_3();
  }
  else {
    if (matrix->type == 0) {
      if (_s1 == (char *)0x0) {
        parasail_nw_table_diag_avx2_256_32_cold_2();
        return (parasail_result_t *)0x0;
      }
      if (_s1Len < 1) {
        parasail_nw_table_diag_avx2_256_32_cold_1();
        return (parasail_result_t *)0x0;
      }
    }
    else {
      _s1Len = matrix->length;
    }
    auVar38._4_4_ = gap;
    auVar38._0_4_ = gap;
    auVar38._8_4_ = gap;
    auVar38._12_4_ = gap;
    auVar39._16_4_ = gap;
    auVar39._0_16_ = auVar38;
    auVar39._20_4_ = gap;
    auVar39._24_4_ = gap;
    auVar39._28_4_ = gap;
    auVar38 = vpinsrd_avx(auVar38,open,1);
    auVar38 = vpshufd_avx(auVar38,0x40);
    auVar38 = vpmulld_avx(auVar38,_DAT_00909110);
    iVar29 = auVar38._12_4_;
    uVar42 = 0x80000000 - matrix->min;
    if (iVar29 < matrix->min) {
      uVar42 = open | 0x80000000;
    }
    iVar36 = 0x7ffffffe - matrix->max;
    auVar43 = in_ZMM1._0_16_;
    auVar56 = in_ZMM7._0_16_;
    ppVar19 = parasail_result_new_table1(_s1Len,s2Len);
    if (ppVar19 != (parasail_result_t *)0x0) {
      ppVar19->flag = ppVar19->flag | 0x8421001;
      uVar24 = (ulong)(s2Len + 0xe);
      ptr = (undefined1 (*) [16])parasail_memalign_int32_t(0x20,uVar24);
      ptr_00 = parasail_memalign_int32_t(0x20,uVar24);
      ptr_01 = parasail_memalign_int32_t(0x20,uVar24);
      if (ptr_01 != (int32_t *)0x0 && (ptr_00 != (int32_t *)0x0 && ptr != (undefined1 (*) [16])0x0))
      {
        if (matrix->type == 0) {
          iVar14 = _s1Len + 7;
          ptr_02 = parasail_memalign_int32_t(0x20,(long)iVar14);
          if (ptr_02 == (int32_t *)0x0) {
            return (parasail_result_t *)0x0;
          }
          if (0 < _s1Len) {
            piVar4 = matrix->mapper;
            uVar24 = 0;
            do {
              ptr_02[uVar24] = piVar4[(byte)_s1[uVar24]];
              uVar24 = uVar24 + 1;
            } while ((uint)_s1Len != uVar24);
          }
          iVar15 = _s1Len + 1U;
          if ((int)(_s1Len + 1U) < iVar14) {
            iVar15 = iVar14;
          }
          memset(ptr_02 + _s1Len,0,(ulong)(uint)(~_s1Len + iVar15) * 4 + 4);
        }
        else {
          ptr_02 = (int32_t *)0x0;
        }
        uVar18 = s2Len + 7;
        auVar47 = vpinsrd_avx(ZEXT416((uint)_s1Len),s2Len,1);
        auVar43 = vpcmpeqd_avx(auVar43,auVar43);
        auVar43 = vpaddd_avx(auVar47,auVar43);
        iVar14 = uVar42 + 1;
        auVar47._4_4_ = open;
        auVar47._0_4_ = open;
        auVar47._8_4_ = open;
        auVar47._12_4_ = open;
        auVar48._16_4_ = open;
        auVar48._0_16_ = auVar47;
        auVar48._20_4_ = open;
        auVar48._24_4_ = open;
        auVar48._28_4_ = open;
        iVar15 = gap * 8;
        uVar42 = auVar43._0_4_;
        auVar40._8_4_ = 1;
        auVar40._0_8_ = 0x100000001;
        auVar40._12_4_ = 1;
        auVar40._16_4_ = 1;
        auVar40._20_4_ = 1;
        auVar40._24_4_ = 1;
        auVar40._28_4_ = 1;
        local_138 = auVar43._0_8_;
        auVar9 = vpermd_avx2(auVar40,ZEXT1632(auVar43));
        iVar16 = iVar29 - gap;
        iVar25 = iVar29 + gap * -2;
        iVar22 = -(gap * 3 + open);
        auVar43 = vpinsrd_avx(auVar47,gap * 4,1);
        auVar43 = vpshufd_avx(auVar43,0x40);
        auVar43 = vpsubd_avx(auVar38,auVar43);
        auVar44._4_4_ = iVar22;
        auVar44._0_4_ = iVar22;
        auVar44._8_4_ = iVar22;
        auVar44._12_4_ = iVar22;
        auVar44._16_4_ = iVar22;
        auVar44._20_4_ = iVar22;
        auVar44._24_4_ = iVar22;
        auVar44._28_4_ = iVar22;
        auVar40 = vpblendd_avx2(ZEXT1632(auVar43),auVar44,0x10);
        auVar49._4_4_ = iVar25;
        auVar49._0_4_ = iVar25;
        auVar49._8_4_ = iVar25;
        auVar49._12_4_ = iVar25;
        auVar49._16_4_ = iVar25;
        auVar49._20_4_ = iVar25;
        auVar49._24_4_ = iVar25;
        auVar49._28_4_ = iVar25;
        auVar40 = vpblendd_avx2(auVar40,auVar49,0x20);
        auVar50._4_4_ = iVar16;
        auVar50._0_4_ = iVar16;
        auVar50._8_4_ = iVar16;
        auVar50._12_4_ = iVar16;
        auVar50._16_4_ = iVar16;
        auVar50._20_4_ = iVar16;
        auVar50._24_4_ = iVar16;
        auVar50._28_4_ = iVar16;
        auVar40 = vpblendd_avx2(auVar40,auVar50,0x40);
        auVar41._0_16_ = ZEXT116(0) * auVar38 + ZEXT116(1) * auVar43;
        auVar41._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar38;
        local_178 = vpblendd_avx2(auVar40,auVar41,0x88);
        piVar4 = matrix->mapper;
        uVar37 = (ulong)(uint)s2Len;
        uVar24 = 0;
        do {
          *(int *)(ptr[1] + uVar24 * 4 + 0xc) = piVar4[(byte)_s2[uVar24]];
          uVar24 = uVar24 + 1;
        } while (uVar37 != uVar24);
        *(undefined1 (*) [16])(*ptr + 0xc) = (undefined1  [16])0x0;
        *ptr = (undefined1  [16])0x0;
        uVar17 = s2Len + 1U;
        if ((int)(s2Len + 1U) < (int)uVar18) {
          uVar17 = uVar18;
        }
        uVar24 = 0;
        auVar40 = ZEXT1632(auVar56);
        memset(ptr[1] + uVar37 * 4 + 0xc,0,(ulong)(~s2Len + uVar17) * 4 + 4);
        iVar16 = iVar29;
        do {
          ptr_00[uVar24 + 7] = iVar16;
          ptr_01[uVar24 + 7] = iVar14;
          uVar24 = uVar24 + 1;
          iVar16 = iVar16 - gap;
        } while (uVar37 != uVar24);
        lVar20 = 0;
        do {
          ptr_00[lVar20] = iVar14;
          ptr_01[lVar20] = iVar14;
          lVar20 = lVar20 + 1;
        } while (lVar20 != 7);
        lVar20 = uVar37 + 7;
        do {
          ptr_00[lVar20] = iVar14;
          ptr_01[lVar20] = iVar14;
          lVar20 = lVar20 + 1;
          s2Len = s2Len + 1;
        } while (s2Len < (int)uVar18);
        ptr_00[6] = 0;
        if (_s1Len < 1) {
          auVar45._4_4_ = iVar14;
          auVar45._0_4_ = iVar14;
          auVar45._8_4_ = iVar14;
          auVar45._12_4_ = iVar14;
          auVar45._16_4_ = iVar14;
          auVar45._20_4_ = iVar14;
          auVar45._24_4_ = iVar14;
          auVar45._28_4_ = iVar14;
          auVar53 = ZEXT3264(auVar45);
          auVar51._4_4_ = iVar36;
          auVar51._0_4_ = iVar36;
          auVar51._8_4_ = iVar36;
          auVar51._12_4_ = iVar36;
          auVar51._16_4_ = iVar36;
          auVar51._20_4_ = iVar36;
          auVar51._24_4_ = iVar36;
          auVar51._28_4_ = iVar36;
        }
        else {
          piVar4 = matrix->matrix;
          auVar8._4_4_ = iVar14;
          auVar8._0_4_ = iVar14;
          auVar8._8_4_ = iVar14;
          auVar8._12_4_ = iVar14;
          auVar8._16_4_ = iVar14;
          auVar8._20_4_ = iVar14;
          auVar8._24_4_ = iVar14;
          auVar8._28_4_ = iVar14;
          auVar41 = vpalignr_avx2(ZEXT1632(auVar8._16_16_),auVar8,4);
          uVar24 = 1;
          if (1 < (int)uVar18) {
            uVar24 = (ulong)uVar18;
          }
          uVar26 = (ulong)(uint)_s1Len;
          local_1f0 = uVar37 * 0x1c + -0x1c;
          lVar20 = uVar37 * 0x20;
          local_1f8 = uVar37 * 4 + -4;
          local_208 = uVar37 * 0x18 + -0x18;
          local_210 = uVar37 * 0x14 + -0x14;
          local_218 = uVar37 * 8 + -8;
          local_220 = uVar37 * 0x10 + -0x10;
          local_228 = uVar37 * 0xc + -0xc;
          auVar44 = vpmovsxbd_avx2(ZEXT816(0x1020304050607));
          local_200 = 0;
          auVar49 = vpmovsxbd_avx2(ZEXT816(0x7060504030201));
          auVar40 = vpcmpeqd_avx2(auVar40,auVar40);
          auVar53 = ZEXT3264(auVar8);
          auVar52 = ZEXT3264(CONCAT428(iVar36,CONCAT424(iVar36,CONCAT420(iVar36,CONCAT416(iVar36,
                                                  CONCAT412(iVar36,CONCAT48(iVar36,CONCAT44(iVar36,
                                                  iVar36))))))));
          auVar46 = ZEXT3264(auVar8);
          uVar21 = 0;
          do {
            uVar31 = uVar21 | 3;
            uVar18 = (uint)uVar21;
            if (matrix->type == 0) {
              uVar17 = ptr_02[uVar21 + 1];
              uVar23 = ptr_02[uVar21 + 2];
              uVar30 = ptr_02[uVar31];
              uVar32 = ptr_02[uVar21 + 4];
              uVar33 = ptr_02[uVar21 + 5];
              uVar34 = ptr_02[uVar21 + 6];
              uVar27 = ptr_02[uVar21];
              uVar35 = ptr_02[uVar21 + 7];
            }
            else {
              uVar17 = uVar18 | 1;
              if (uVar26 <= (uVar21 | 1)) {
                uVar17 = uVar42;
              }
              uVar23 = uVar18 | 2;
              if (uVar26 <= (uVar21 | 2)) {
                uVar23 = uVar42;
              }
              uVar30 = uVar18 | 3;
              if (uVar26 <= uVar31) {
                uVar30 = uVar42;
              }
              uVar32 = uVar18 | 4;
              if (uVar26 <= (uVar21 | 4)) {
                uVar32 = uVar42;
              }
              uVar33 = uVar18 | 5;
              if (uVar26 <= (uVar21 | 5)) {
                uVar33 = uVar42;
              }
              uVar34 = uVar18 | 6;
              if (uVar26 <= (uVar21 | 6)) {
                uVar34 = uVar42;
              }
              uVar27 = uVar18;
              uVar35 = uVar18 | 7;
              if (uVar26 <= (uVar21 | 7)) {
                uVar35 = uVar42;
              }
            }
            iVar16 = matrix->size;
            uVar1 = uVar21 + 8;
            iVar2 = ptr_00[6];
            auVar54._4_4_ = iVar2;
            auVar54._0_4_ = iVar2;
            auVar54._8_4_ = iVar2;
            auVar54._12_4_ = iVar2;
            auVar54._16_4_ = iVar2;
            auVar54._20_4_ = iVar2;
            auVar54._24_4_ = iVar2;
            auVar54._28_4_ = iVar2;
            ptr_00[6] = iVar29 - (int)uVar1 * gap;
            iVar22 = iVar29 - uVar18 * gap;
            auVar57._4_4_ = iVar22;
            auVar57._0_4_ = iVar22;
            auVar57._8_4_ = iVar22;
            auVar57._12_4_ = iVar22;
            auVar57._16_4_ = iVar22;
            auVar57._20_4_ = iVar22;
            auVar57._24_4_ = iVar22;
            auVar57._28_4_ = iVar22;
            auVar50 = vpblendd_avx2(auVar41,auVar57,0x80);
            auVar57 = vpblendd_avx2(auVar41,auVar54,0x80);
            auVar6._4_4_ = uVar42;
            auVar6._0_4_ = uVar42;
            auVar6._8_4_ = uVar42;
            auVar6._12_4_ = uVar42;
            auVar6._16_4_ = uVar42;
            auVar6._20_4_ = uVar42;
            auVar6._24_4_ = uVar42;
            auVar6._28_4_ = uVar42;
            auVar6 = vpcmpeqd_avx2(auVar44,auVar6);
            uVar28 = 0;
            auVar54 = vpmovsxbd_avx2(ZEXT816(0xfffefdfcfbfaf9));
            auVar7._4_4_ = iVar14;
            auVar7._0_4_ = iVar14;
            auVar7._8_4_ = iVar14;
            auVar7._12_4_ = iVar14;
            auVar7._16_4_ = iVar14;
            auVar7._20_4_ = iVar14;
            auVar7._24_4_ = iVar14;
            auVar7._28_4_ = iVar14;
            auVar8 = auVar7;
            do {
              auVar38 = vpinsrd_avx(ZEXT416((uint)piVar4[(long)(int)(uVar30 * iVar16) +
                                                         (long)*(int *)(ptr[1] + uVar28 * 4)]),
                                    piVar4[(long)(int)(uVar23 * iVar16) +
                                           (long)*(int *)(ptr[1] + uVar28 * 4 + 4)],1);
              auVar38 = vpinsrd_avx(auVar38,piVar4[(long)(int)(uVar17 * iVar16) +
                                                   (long)*(int *)(ptr[1] + uVar28 * 4 + 8)],2);
              auVar38 = vpinsrd_avx(auVar38,piVar4[(long)(int)(uVar27 * iVar16) +
                                                   (long)*(int *)(ptr[1] + uVar28 * 4 + 0xc)],3);
              auVar43 = vpinsrd_avx(ZEXT416((uint)piVar4[(long)(int)(uVar35 * iVar16) +
                                                         (long)*(int *)(*ptr + uVar28 * 4)]),
                                    piVar4[(long)(int)(uVar34 * iVar16) +
                                           (long)*(int *)(*ptr + uVar28 * 4 + 4)],1);
              auVar43 = vpinsrd_avx(auVar43,piVar4[(long)(int)(uVar33 * iVar16) +
                                                   (long)*(int *)(*ptr + uVar28 * 4 + 8)],2);
              auVar43 = vpinsrd_avx(auVar43,piVar4[(long)(int)(uVar32 * iVar16) +
                                                   (long)*(int *)(*ptr + uVar28 * 4 + 0xc)],3);
              auVar55._0_16_ = ZEXT116(0) * auVar38 + ZEXT116(1) * auVar43;
              auVar55._16_16_ = ZEXT116(1) * auVar38;
              auVar51 = vpermd_avx2(auVar49,auVar50);
              auVar45 = vpaddd_avx2(auVar57,auVar55);
              iVar2 = ptr_00[uVar28 + 7];
              auVar58._4_4_ = iVar2;
              auVar58._0_4_ = iVar2;
              auVar58._8_4_ = iVar2;
              auVar58._12_4_ = iVar2;
              auVar58._16_4_ = iVar2;
              auVar58._20_4_ = iVar2;
              auVar58._24_4_ = iVar2;
              auVar58._28_4_ = iVar2;
              auVar57 = vpblendd_avx2(auVar51,auVar58,0x80);
              auVar51 = vpermd_avx2(auVar49,auVar8);
              iVar2 = ptr_01[uVar28 + 7];
              auVar59._4_4_ = iVar2;
              auVar59._0_4_ = iVar2;
              auVar59._8_4_ = iVar2;
              auVar59._12_4_ = iVar2;
              auVar59._16_4_ = iVar2;
              auVar59._20_4_ = iVar2;
              auVar59._24_4_ = iVar2;
              auVar59._28_4_ = iVar2;
              auVar8 = vpblendd_avx2(auVar51,auVar59,0x80);
              auVar51 = vpsubd_avx2(auVar57,auVar48);
              auVar8 = vpsubd_avx2(auVar8,auVar39);
              auVar8 = vpmaxsd_avx2(auVar51,auVar8);
              auVar50 = vpsubd_avx2(auVar50,auVar48);
              auVar51 = vpsubd_avx2(auVar7,auVar39);
              auVar55 = vpmaxsd_avx2(auVar50,auVar51);
              auVar50 = vpmaxsd_avx2(auVar55,auVar8);
              auVar50 = vpmaxsd_avx2(auVar45,auVar50);
              auVar7 = vpcmpeqd_avx2(auVar54,auVar40);
              auVar50 = vblendvps_avx(auVar50,local_178,auVar7);
              if (7 < uVar28) {
                auVar45 = vpminsd_avx2(auVar52._0_32_,auVar50);
                auVar52 = ZEXT3264(auVar45);
                auVar45 = vpmaxsd_avx2(auVar46._0_32_,auVar50);
                auVar46 = ZEXT3264(auVar45);
              }
              auVar45 = auVar46._0_32_;
              auVar51 = auVar52._0_32_;
              piVar5 = ((ppVar19->field_4).rowcols)->score_row;
              auVar38 = auVar50._16_16_;
              if (uVar28 < uVar37) {
                uVar3 = vextractps_avx(auVar38,3);
                *(undefined4 *)((long)piVar5 + uVar28 * 4 + local_200) = uVar3;
              }
              if (uVar28 - 1 < uVar37 && (uVar21 | 1) < uVar26) {
                uVar3 = vextractps_avx(auVar38,2);
                *(undefined4 *)((long)piVar5 + uVar28 * 4 + local_1f8) = uVar3;
              }
              if (((uVar21 | 2) < uVar26) && ((long)(uVar28 - 2) < (long)uVar37 && 1 < uVar28)) {
                uVar3 = vextractps_avx(auVar38,1);
                *(undefined4 *)((long)piVar5 + uVar28 * 4 + local_218) = uVar3;
              }
              if ((uVar31 < uVar26) && ((long)(uVar28 - 3) < (long)uVar37 && 2 < uVar28)) {
                *(int *)((long)piVar5 + uVar28 * 4 + local_228) = auVar50._16_4_;
              }
              if (((uVar21 | 4) < uVar26) && ((long)(uVar28 - 4) < (long)uVar37 && 3 < uVar28)) {
                *(int *)((long)piVar5 + uVar28 * 4 + local_220) = auVar50._12_4_;
              }
              if (((uVar21 | 5) < uVar26) && ((long)(uVar28 - 5) < (long)uVar37 && 4 < uVar28)) {
                *(int *)((long)piVar5 + uVar28 * 4 + local_210) = auVar50._8_4_;
              }
              if (((uVar21 | 6) < uVar26) && ((long)(uVar28 - 6) < (long)uVar37 && 5 < uVar28)) {
                *(int *)((long)piVar5 + uVar28 * 4 + local_208) = auVar50._4_4_;
              }
              if (6 < uVar28 && (uVar21 | 7) < uVar26) {
                *(int32_t *)((long)piVar5 + uVar28 * 4 + local_1f0) = auVar50._0_4_;
              }
              auVar10._4_4_ = iVar14;
              auVar10._0_4_ = iVar14;
              auVar10._8_4_ = iVar14;
              auVar10._12_4_ = iVar14;
              auVar10._16_4_ = iVar14;
              auVar10._20_4_ = iVar14;
              auVar10._24_4_ = iVar14;
              auVar10._28_4_ = iVar14;
              auVar8 = vblendvps_avx(auVar8,auVar10,auVar7);
              auVar7 = vblendvps_avx(auVar55,auVar10,auVar7);
              ptr_00[uVar28] = auVar50._0_4_;
              ptr_01[uVar28] = auVar8._0_4_;
              auVar55 = vpcmpeqd_avx2(auVar54,auVar9);
              auVar55 = vpand_avx2(auVar6,auVar55);
              auVar55 = vblendvps_avx(auVar53._0_32_,auVar50,auVar55);
              auVar53 = ZEXT3264(auVar55);
              auVar54 = vpsubd_avx2(auVar54,auVar40);
              uVar28 = uVar28 + 1;
            } while (uVar24 != uVar28);
            auVar12._8_4_ = 8;
            auVar12._0_8_ = 0x800000008;
            auVar12._12_4_ = 8;
            auVar12._16_4_ = 8;
            auVar12._20_4_ = 8;
            auVar12._24_4_ = 8;
            auVar12._28_4_ = 8;
            auVar44 = vpaddd_avx2(auVar44,auVar12);
            auVar13._4_4_ = iVar15;
            auVar13._0_4_ = iVar15;
            auVar13._8_4_ = iVar15;
            auVar13._12_4_ = iVar15;
            auVar13._16_4_ = iVar15;
            auVar13._20_4_ = iVar15;
            auVar13._24_4_ = iVar15;
            auVar13._28_4_ = iVar15;
            local_178 = vpsubd_avx2(local_178,auVar13);
            local_1f0 = local_1f0 + lVar20;
            local_200 = local_200 + lVar20;
            local_1f8 = local_1f8 + lVar20;
            local_208 = local_208 + lVar20;
            local_210 = local_210 + lVar20;
            local_220 = local_220 + lVar20;
            local_228 = local_228 + lVar20;
            local_218 = local_218 + lVar20;
            uVar21 = uVar1;
          } while (uVar1 < uVar26);
        }
        iVar15 = 8;
        iVar29 = iVar14;
        do {
          if (iVar29 < auVar53._28_4_) {
            iVar29 = auVar53._28_4_;
          }
          auVar40 = auVar53._0_32_;
          auVar39 = vperm2i128_avx2(auVar40,auVar40,0x28);
          auVar39 = vpalignr_avx2(auVar40,auVar39,0xc);
          auVar53 = ZEXT3264(auVar39);
          iVar15 = iVar15 + -1;
        } while (iVar15 != 0);
        auVar9._4_4_ = iVar14;
        auVar9._0_4_ = iVar14;
        auVar9._8_4_ = iVar14;
        auVar9._12_4_ = iVar14;
        auVar9._16_4_ = iVar14;
        auVar9._20_4_ = iVar14;
        auVar9._24_4_ = iVar14;
        auVar9._28_4_ = iVar14;
        auVar39 = vpcmpgtd_avx2(auVar9,auVar51);
        auVar11._4_4_ = iVar36;
        auVar11._0_4_ = iVar36;
        auVar11._8_4_ = iVar36;
        auVar11._12_4_ = iVar36;
        auVar11._16_4_ = iVar36;
        auVar11._20_4_ = iVar36;
        auVar11._24_4_ = iVar36;
        auVar11._28_4_ = iVar36;
        auVar40 = vpcmpgtd_avx2(auVar45,auVar11);
        auVar39 = vpor_avx2(auVar39,auVar40);
        if ((((((((auVar39 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar39 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar39 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar39 >> 0x7f,0) != '\0') ||
              (auVar39 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar39 >> 0xbf,0) != '\0') ||
            (auVar39 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar39[0x1f] < '\0') {
          *(byte *)&ppVar19->flag = (byte)ppVar19->flag | 0x40;
          local_138 = 0;
          iVar29 = 0;
        }
        ppVar19->score = iVar29;
        ppVar19->end_query = (undefined4)local_138;
        ppVar19->end_ref = local_138._4_4_;
        parasail_free(ptr_01);
        parasail_free(ptr_00);
        parasail_free(ptr);
        if (matrix->type == 0) {
          parasail_free(ptr_02);
          return ppVar19;
        }
        return ppVar19;
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix)
{
    /* declare local variables */
    int32_t N = 0;
    int32_t PAD = 0;
    int32_t PAD2 = 0;
    int32_t s1Len = 0;
    int32_t s1Len_PAD = 0;
    int32_t s2Len_PAD = 0;
    int32_t * restrict s1 = NULL;
    int32_t * restrict s2B = NULL;
    int32_t * restrict _H_pr = NULL;
    int32_t * restrict _F_pr = NULL;
    int32_t * restrict s2 = NULL;
    int32_t * restrict H_pr = NULL;
    int32_t * restrict F_pr = NULL;
    parasail_result_t *result = NULL;
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t NEG_LIMIT = 0;
    int32_t POS_LIMIT = 0;
    int32_t score = 0;
    __m256i vNegLimit;
    __m256i vPosLimit;
    __m256i vSaturationCheckMin;
    __m256i vSaturationCheckMax;
    __m256i vNegInf;
    __m256i vOpen;
    __m256i vGap;
    __m256i vOne;
    __m256i vN;
    __m256i vGapN;
    __m256i vNegOne;
    __m256i vI;
    __m256i vJreset;
    __m256i vMax;
    __m256i vILimit;
    __m256i vILimit1;
    __m256i vJLimit;
    __m256i vJLimit1;
    __m256i vIBoundary;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    N = 8; /* number of values in vector */
    PAD = N-1;
    PAD2 = PAD*2;
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    s1Len_PAD = s1Len+PAD;
    s2Len_PAD = s2Len+PAD;
    i = 0;
    j = 0;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    NEG_LIMIT = (-open < matrix->min ? INT32_MIN + open : INT32_MIN - matrix->min) + 1;
    POS_LIMIT = INT32_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm256_set1_epi32(NEG_LIMIT);
    vPosLimit = _mm256_set1_epi32(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInf = _mm256_set1_epi32(NEG_LIMIT);
    vOpen = _mm256_set1_epi32(open);
    vGap  = _mm256_set1_epi32(gap);
    vOne = _mm256_set1_epi32(1);
    vN = _mm256_set1_epi32(N);
    vGapN = _mm256_set1_epi32(gap*N);
    vNegOne = _mm256_set1_epi32(-1);
    vI = _mm256_set_epi32(0,1,2,3,4,5,6,7);
    vJreset = _mm256_set_epi32(0,-1,-2,-3,-4,-5,-6,-7);
    vMax = vNegInf;
    vILimit = _mm256_set1_epi32(s1Len);
    vILimit1 = _mm256_sub_epi32(vILimit, vOne);
    vJLimit = _mm256_set1_epi32(s2Len);
    vJLimit1 = _mm256_sub_epi32(vJLimit, vOne);
    vIBoundary = _mm256_set_epi32(
            -open-0*gap,
            -open-1*gap,
            -open-2*gap,
            -open-3*gap,
            -open-4*gap,
            -open-5*gap,
            -open-6*gap,
            -open-7*gap);

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(s1Len, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_DIAG
        | PARASAIL_FLAG_BITS_32 | PARASAIL_FLAG_LANES_8;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    s2B= parasail_memalign_int32_t(32, s2Len+PAD2);
    _H_pr = parasail_memalign_int32_t(32, s2Len+PAD2);
    _F_pr = parasail_memalign_int32_t(32, s2Len+PAD2);
    s2 = s2B+PAD; /* will allow later for negative indices */
    H_pr = _H_pr+PAD;
    F_pr = _F_pr+PAD;

    /* validate heap variables */
    if (!s2B) return NULL;
    if (!_H_pr) return NULL;
    if (!_F_pr) return NULL;

    /* convert _s1 from char to int in range 0-23 */
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        s1 = parasail_memalign_int32_t(32, s1Len+PAD);
        if (!s1) return NULL;
        for (i=0; i<s1Len; ++i) {
            s1[i] = matrix->mapper[(unsigned char)_s1[i]];
        }
        /* pad back of s1 with dummy values */
        for (i=s1Len; i<s1Len_PAD; ++i) {
            s1[i] = 0; /* point to first matrix row because we don't care */
        }
    }

    /* convert _s2 from char to int in range 0-23 */
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }
    /* pad front of s2 with dummy values */
    for (j=-PAD; j<0; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }
    /* pad back of s2 with dummy values */
    for (j=s2Len; j<s2Len_PAD; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }

    /* set initial values for stored row */
    for (j=0; j<s2Len; ++j) {
        H_pr[j] = -open - j*gap;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad front of stored row values */
    for (j=-PAD; j<0; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad back of stored row values */
    for (j=s2Len; j<s2Len+PAD; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    H_pr[-1] = 0; /* upper left corner */

    /* iterate over query sequence */
    for (i=0; i<s1Len; i+=N) {
        __m256i vNH = vNegInf;
        __m256i vWH = vNegInf;
        __m256i vE = vNegInf;
        __m256i vF = vNegInf;
        __m256i vJ = vJreset;
        const int * const restrict matrow0 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+0] : ((i+0 >= s1Len) ? s1Len-1 : i+0))];
        const int * const restrict matrow1 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+1] : ((i+1 >= s1Len) ? s1Len-1 : i+1))];
        const int * const restrict matrow2 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+2] : ((i+2 >= s1Len) ? s1Len-1 : i+2))];
        const int * const restrict matrow3 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+3] : ((i+3 >= s1Len) ? s1Len-1 : i+3))];
        const int * const restrict matrow4 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+4] : ((i+4 >= s1Len) ? s1Len-1 : i+4))];
        const int * const restrict matrow5 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+5] : ((i+5 >= s1Len) ? s1Len-1 : i+5))];
        const int * const restrict matrow6 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+6] : ((i+6 >= s1Len) ? s1Len-1 : i+6))];
        const int * const restrict matrow7 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+7] : ((i+7 >= s1Len) ? s1Len-1 : i+7))];
        vNH = _mm256_srli_si256_rpl(vNH, 4);
        vNH = _mm256_insert_epi32_rpl(vNH, H_pr[-1], 7);
        vWH = _mm256_srli_si256_rpl(vWH, 4);
        vWH = _mm256_insert_epi32_rpl(vWH, -open - i*gap, 7);
        H_pr[-1] = -open - (i+N)*gap;
        /* iterate over database sequence */
        for (j=0; j<s2Len+PAD; ++j) {
            __m256i vMat;
            __m256i vNWH = vNH;
            vNH = _mm256_srli_si256_rpl(vWH, 4);
            vNH = _mm256_insert_epi32_rpl(vNH, H_pr[j], 7);
            vF = _mm256_srli_si256_rpl(vF, 4);
            vF = _mm256_insert_epi32_rpl(vF, F_pr[j], 7);
            vF = _mm256_max_epi32(
                    _mm256_sub_epi32(vNH, vOpen),
                    _mm256_sub_epi32(vF, vGap));
            vE = _mm256_max_epi32(
                    _mm256_sub_epi32(vWH, vOpen),
                    _mm256_sub_epi32(vE, vGap));
            vMat = _mm256_set_epi32(
                    matrow0[s2[j-0]],
                    matrow1[s2[j-1]],
                    matrow2[s2[j-2]],
                    matrow3[s2[j-3]],
                    matrow4[s2[j-4]],
                    matrow5[s2[j-5]],
                    matrow6[s2[j-6]],
                    matrow7[s2[j-7]]
                    );
            vNWH = _mm256_add_epi32(vNWH, vMat);
            vWH = _mm256_max_epi32(vNWH, vE);
            vWH = _mm256_max_epi32(vWH, vF);
            /* as minor diagonal vector passes across the j=-1 boundary,
             * assign the appropriate boundary conditions */
            {
                __m256i cond = _mm256_cmpeq_epi32(vJ,vNegOne);
                vWH = _mm256_blendv_epi8(vWH, vIBoundary, cond);
                vF = _mm256_blendv_epi8(vF, vNegInf, cond);
                vE = _mm256_blendv_epi8(vE, vNegInf, cond);
            }
            /* cannot start checking sat until after J clears boundary */
            if (j > PAD) {
                vSaturationCheckMin = _mm256_min_epi32(vSaturationCheckMin, vWH);
                vSaturationCheckMax = _mm256_max_epi32(vSaturationCheckMax, vWH);
            }
#ifdef PARASAIL_TABLE
            arr_store_si256(result->tables->score_table, vWH, i, s1Len, j, s2Len);
#endif
#ifdef PARASAIL_ROWCOL
            arr_store_rowcol(result->rowcols->score_row, result->rowcols->score_col, vWH, i, s1Len, j, s2Len);
#endif
            H_pr[j-7] = (int32_t)_mm256_extract_epi32_rpl(vWH,0);
            F_pr[j-7] = (int32_t)_mm256_extract_epi32_rpl(vF,0);
            /* as minor diagonal vector passes across table, extract
               last table value at the i,j bound */
            {
                __m256i cond_valid_I = _mm256_cmpeq_epi32(vI, vILimit1);
                __m256i cond_valid_J = _mm256_cmpeq_epi32(vJ, vJLimit1);
                __m256i cond_all = _mm256_and_si256(cond_valid_I, cond_valid_J);
                vMax = _mm256_blendv_epi8(vMax, vWH, cond_all);
            }
            vJ = _mm256_add_epi32(vJ, vOne);
        }
        vI = _mm256_add_epi32(vI, vN);
        vIBoundary = _mm256_sub_epi32(vIBoundary, vGapN);
    }

    /* max in vMax */
    for (i=0; i<N; ++i) {
        int32_t value;
        value = (int32_t) _mm256_extract_epi32_rpl(vMax, 7);
        if (value > score) {
            score = value;
        }
        vMax = _mm256_slli_si256_rpl(vMax, 4);
    }

    if (_mm256_movemask_epi8(_mm256_or_si256(
            _mm256_cmplt_epi32_rpl(vSaturationCheckMin, vNegLimit),
            _mm256_cmpgt_epi32(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(_F_pr);
    parasail_free(_H_pr);
    parasail_free(s2B);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        parasail_free(s1);
    }

    return result;
}